

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O0

bool __thiscall
cmFindLibraryCommand::InitialPass
          (cmFindLibraryCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *argsIn)

{
  cmMakefile *this_00;
  bool bVar1;
  uint uVar2;
  char *suffix;
  cmState *pcVar3;
  bool local_14b;
  bool local_133;
  bool local_119;
  undefined1 local_f8 [8];
  string library;
  string local_d0;
  byte local_ab;
  byte local_aa;
  allocator<char> local_a9;
  string local_a8;
  byte local_83;
  byte local_82;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  cmValue local_28;
  cmValue customLib;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *argsIn_local;
  cmFindLibraryCommand *this_local;
  
  customLib.Value = (string *)argsIn;
  std::__cxx11::string::operator=
            ((string *)&(this->super_cmFindBase).super_cmFindCommon.CMakePathName,"LIBRARY");
  uVar2 = (*(this->super_cmFindBase)._vptr_cmFindBase[2])(this,customLib.Value);
  if ((uVar2 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = cmFindCommon::ComputeIfDebugModeWanted
                      (&(this->super_cmFindBase).super_cmFindCommon,
                       &(this->super_cmFindBase).VariableName);
    (this->super_cmFindBase).super_cmFindCommon.DebugMode = bVar1;
    if (((this->super_cmFindBase).AlreadyDefined & 1U) == 0) {
      this_00 = (this->super_cmFindBase).super_cmFindCommon.Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"CMAKE_FIND_LIBRARY_CUSTOM_LIB_SUFFIX",&local_49);
      local_28 = cmMakefile::GetDefinition(this_00,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::allocator<char>::~allocator(&local_49);
      bVar1 = cmValue::operator_cast_to_bool(&local_28);
      if (bVar1) {
        cmValue::operator->[abi_cxx11_(&local_28);
        suffix = (char *)std::__cxx11::string::c_str();
        AddArchitecturePaths(this,suffix);
      }
      else {
        bVar1 = cmMakefile::PlatformIs32Bit((this->super_cmFindBase).super_cmFindCommon.Makefile);
        local_82 = 0;
        local_83 = 0;
        local_119 = false;
        if (bVar1) {
          pcVar3 = cmMakefile::GetState((this->super_cmFindBase).super_cmFindCommon.Makefile);
          std::allocator<char>::allocator();
          local_82 = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_80,"FIND_LIBRARY_USE_LIB32_PATHS",&local_81);
          local_83 = 1;
          local_119 = cmState::GetGlobalPropertyAsBool(pcVar3,&local_80);
        }
        if ((local_83 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_80);
        }
        if ((local_82 & 1) != 0) {
          std::allocator<char>::~allocator(&local_81);
        }
        if (local_119 == false) {
          bVar1 = cmMakefile::PlatformIs64Bit((this->super_cmFindBase).super_cmFindCommon.Makefile);
          local_aa = 0;
          local_ab = 0;
          local_133 = false;
          if (bVar1) {
            pcVar3 = cmMakefile::GetState((this->super_cmFindBase).super_cmFindCommon.Makefile);
            std::allocator<char>::allocator();
            local_aa = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_a8,"FIND_LIBRARY_USE_LIB64_PATHS",&local_a9);
            local_ab = 1;
            local_133 = cmState::GetGlobalPropertyAsBool(pcVar3,&local_a8);
          }
          if ((local_ab & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_a8);
          }
          if ((local_aa & 1) != 0) {
            std::allocator<char>::~allocator(&local_a9);
          }
          if (local_133 == false) {
            bVar1 = cmMakefile::PlatformIsx32((this->super_cmFindBase).super_cmFindCommon.Makefile);
            library.field_2._M_local_buf[0xe] = '\0';
            library.field_2._M_local_buf[0xd] = '\0';
            local_14b = false;
            if (bVar1) {
              pcVar3 = cmMakefile::GetState((this->super_cmFindBase).super_cmFindCommon.Makefile);
              std::allocator<char>::allocator();
              library.field_2._M_local_buf[0xe] = '\x01';
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_d0,"FIND_LIBRARY_USE_LIBX32_PATHS",
                         (allocator<char> *)(library.field_2._M_local_buf + 0xf));
              library.field_2._M_local_buf[0xd] = '\x01';
              local_14b = cmState::GetGlobalPropertyAsBool(pcVar3,&local_d0);
            }
            if ((library.field_2._M_local_buf[0xd] & 1U) != 0) {
              std::__cxx11::string::~string((string *)&local_d0);
            }
            if ((library.field_2._M_local_buf[0xe] & 1U) != 0) {
              std::allocator<char>::~allocator
                        ((allocator<char> *)(library.field_2._M_local_buf + 0xf));
            }
            if (local_14b != false) {
              AddArchitecturePaths(this,"x32");
            }
          }
          else {
            AddArchitecturePaths(this,"64");
          }
        }
        else {
          AddArchitecturePaths(this,"32");
        }
      }
      FindLibrary_abi_cxx11_((string *)local_f8,this);
      cmFindBase::StoreFindResult(&this->super_cmFindBase,(string *)local_f8);
      this_local._7_1_ = true;
      std::__cxx11::string::~string((string *)local_f8);
    }
    else {
      cmFindBase::NormalizeFindResult(&this->super_cmFindBase);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool cmFindLibraryCommand::InitialPass(std::vector<std::string> const& argsIn)
{
  this->CMakePathName = "LIBRARY";

  if (!this->ParseArguments(argsIn)) {
    return false;
  }

  this->DebugMode = this->ComputeIfDebugModeWanted(this->VariableName);

  if (this->AlreadyDefined) {
    this->NormalizeFindResult();
    return true;
  }

  // add custom lib<qual> paths instead of using fixed lib32, lib64 or
  // libx32
  if (cmValue customLib = this->Makefile->GetDefinition(
        "CMAKE_FIND_LIBRARY_CUSTOM_LIB_SUFFIX")) {
    this->AddArchitecturePaths(customLib->c_str());
  }
  // add special 32 bit paths if this is a 32 bit compile.
  else if (this->Makefile->PlatformIs32Bit() &&
           this->Makefile->GetState()->GetGlobalPropertyAsBool(
             "FIND_LIBRARY_USE_LIB32_PATHS")) {
    this->AddArchitecturePaths("32");
  }
  // add special 64 bit paths if this is a 64 bit compile.
  else if (this->Makefile->PlatformIs64Bit() &&
           this->Makefile->GetState()->GetGlobalPropertyAsBool(
             "FIND_LIBRARY_USE_LIB64_PATHS")) {
    this->AddArchitecturePaths("64");
  }
  // add special 32 bit paths if this is an x32 compile.
  else if (this->Makefile->PlatformIsx32() &&
           this->Makefile->GetState()->GetGlobalPropertyAsBool(
             "FIND_LIBRARY_USE_LIBX32_PATHS")) {
    this->AddArchitecturePaths("x32");
  }

  std::string const library = this->FindLibrary();
  this->StoreFindResult(library);
  return true;
}